

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_unconditional_join.cpp
# Opt level: O3

vector<duckdb::ColumnBinding,_true> * __thiscall
duckdb::LogicalUnconditionalJoin::GetColumnBindings
          (vector<duckdb::ColumnBinding,_true> *__return_storage_ptr__,
          LogicalUnconditionalJoin *this)

{
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  *this_00;
  reference pvVar1;
  pointer pLVar2;
  vector<duckdb::ColumnBinding,_true> right_bindings;
  void *local_28;
  undefined8 local_20;
  
  this_00 = &(this->super_LogicalOperator).children;
  pvVar1 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::operator[](this_00,0);
  pLVar2 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(pvVar1);
  (*pLVar2->_vptr_LogicalOperator[2])(__return_storage_ptr__,pLVar2);
  pvVar1 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::operator[](this_00,1);
  pLVar2 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(pvVar1);
  (*pLVar2->_vptr_LogicalOperator[2])(&local_28,pLVar2);
  ::std::vector<duckdb::ColumnBinding,std::allocator<duckdb::ColumnBinding>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<duckdb::ColumnBinding*,std::vector<duckdb::ColumnBinding,std::allocator<duckdb::ColumnBinding>>>>
            ((vector<duckdb::ColumnBinding,std::allocator<duckdb::ColumnBinding>> *)
             __return_storage_ptr__,
             (__return_storage_ptr__->
             super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>).
             super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
             _M_impl.super__Vector_impl_data._M_finish,local_28,local_20);
  if (local_28 != (void *)0x0) {
    operator_delete(local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<ColumnBinding> LogicalUnconditionalJoin::GetColumnBindings() {
	auto left_bindings = children[0]->GetColumnBindings();
	auto right_bindings = children[1]->GetColumnBindings();
	left_bindings.insert(left_bindings.end(), right_bindings.begin(), right_bindings.end());
	return left_bindings;
}